

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined8 uVar6;
  seq_t sequence;
  U32 i;
  BIT_DStream_status BVar7;
  long lVar8;
  size_t *psVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  BYTE *pBVar13;
  uint uVar14;
  BYTE *oend;
  BYTE *pBVar15;
  size_t unaff_RBX;
  BYTE *pBVar16;
  uint uVar17;
  size_t sVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  BYTE *__dest;
  bool bVar22;
  BYTE *litPtr;
  BIT_DStream_t local_128;
  ZSTD_fseState local_100;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  size_t local_d0 [3];
  ulong uStack_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  ulong local_98;
  ulong uStack_90;
  size_t local_88;
  uint local_7c;
  size_t local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ZSTD_DCtx *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (dctx->litBufferLocation == ZSTD_not_in_dst) {
    oend = (BYTE *)(maxDstSize + (long)dst);
  }
  else {
    oend = dctx->litBuffer;
  }
  local_a8 = dctx->litPtr;
  local_a0 = local_a8 + dctx->litSize;
  pBVar16 = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_0070b9df;
  pBVar16 = (BYTE *)dctx->prefixStart;
  local_68 = (BYTE *)dctx->virtualStart;
  local_70 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar8 = -0xc;
  do {
    *(ulong *)((long)&uStack_b8 + lVar8 * 2) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar8);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0);
  local_b0 = (BYTE *)dst;
  if (seqSize == 0) {
    local_128.ptr = (char *)0x0;
    local_128.start = (char *)0x0;
    local_128.bitContainer = 0;
    local_128.bitsConsumed = 0;
    local_128._12_4_ = 0;
    local_128.limitPtr = (char *)0x0;
LAB_0070b082:
    bVar22 = false;
    unaff_RBX = 0xffffffffffffffec;
  }
  else {
    local_128.limitPtr = (char *)((long)seqStart + 8);
    local_128.start = (char *)seqStart;
    if (seqSize < 8) {
      local_128.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_128.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_128.bitContainer;
      case 6:
        local_128.bitContainer =
             local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_128.bitContainer =
             local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar17 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      local_128.bitsConsumed = ~uVar17 + 9;
      if (bVar2 == 0) {
        local_128.bitsConsumed = 0;
      }
      local_128.ptr = (char *)seqStart;
      if (bVar2 == 0) goto LAB_0070b082;
      local_128.bitsConsumed = local_128.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_128.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_128.bitContainer = *(size_t *)local_128.ptr;
      bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar17 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      local_128.bitsConsumed = ~uVar17 + 9;
      if (bVar2 == 0) {
        local_128.bitsConsumed = 0;
      }
      if (bVar2 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_0070b082;
    }
    ZSTD_initFseState(&local_100,&local_128,dctx->LLTptr);
    ZSTD_initFseState(&local_f0,&local_128,dctx->OFTptr);
    local_50 = dctx;
    ZSTD_initFseState(&local_e0,&local_128,dctx->MLTptr);
    if (local_b0 == (BYTE *)0x0) {
      __assert_fail("dst != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x63e,
                    "size_t ZSTD_decompressSequences_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                   );
    }
    local_58 = oend + -0x20;
    local_60 = pBVar16;
    dst = local_b0;
    do {
      bVar2 = local_100.table[local_100.state].nbAdditionalBits;
      if (0x10 < bVar2) {
        __assert_fail("llBits <= MaxLLBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x4c8,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      bVar11 = local_e0.table[local_e0.state].nbAdditionalBits;
      if (0x10 < bVar11) {
        __assert_fail("mlBits <= MaxMLBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x4c9,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      bVar3 = local_f0.table[local_f0.state].nbAdditionalBits;
      if (0x1f < bVar3) {
        __assert_fail("ofBits <= MaxOff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x4ca,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      uVar19 = (ulong)local_e0.table[local_e0.state].baseValue;
      uVar17 = local_100.table[local_100.state].baseValue;
      uVar21 = (ulong)uVar17;
      local_38 = (ulong)local_100.table[local_100.state].nextState;
      local_40 = (ulong)local_e0.table[local_e0.state].nextState;
      local_48 = (ulong)local_f0.table[local_f0.state].nextState;
      bVar4 = local_100.table[local_100.state].nbBits;
      bVar5 = local_e0.table[local_e0.state].nbBits;
      uVar14 = (uint)local_f0.table[local_f0.state].nbBits;
      bVar10 = (byte)local_128.bitsConsumed;
      if (bVar3 < 2) {
        if (bVar3 == 0) {
          sVar18 = local_d0[uVar17 == 0];
          psVar9 = local_d0 + (uVar17 != 0);
        }
        else {
          local_128.bitsConsumed = local_128.bitsConsumed + 1;
          lVar8 = (ulong)(local_f0.table[local_f0.state].baseValue + (uint)(uVar17 == 0)) -
                  ((long)(local_128.bitContainer << (bVar10 & 0x3f)) >> 0x3f);
          if (lVar8 == 3) {
            local_d0[0] = local_d0[0] - 1;
          }
          else {
            local_d0[0] = local_d0[lVar8];
          }
          sVar18 = local_d0[0] + (local_d0[0] == 0);
          if (lVar8 != 1) {
            local_d0[2] = local_d0[1];
          }
          psVar9 = local_d0;
        }
      }
      else {
        local_128.bitsConsumed = local_128.bitsConsumed + bVar3;
        sVar18 = ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar3 & 0x3f)) +
                 (ulong)local_f0.table[local_f0.state].baseValue;
        local_d0[2] = local_d0[1];
        psVar9 = local_d0;
      }
      local_d0[1] = *psVar9;
      local_d0[0] = sVar18;
      if (bVar11 != 0) {
        bVar10 = (byte)local_128.bitsConsumed;
        local_128.bitsConsumed = local_128.bitsConsumed + bVar11;
        uVar19 = uVar19 + ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar11 & 0x3f));
      }
      if ((0x1e < (byte)(bVar11 + bVar2 + bVar3)) && (local_128.bitsConsumed < 0x41)) {
        if (local_128.ptr < local_128.limitPtr) {
          if (local_128.ptr != local_128.start) {
            uVar17 = (int)local_128.ptr - (int)local_128.start;
            if (local_128.start <=
                (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
              uVar17 = local_128.bitsConsumed >> 3;
            }
            local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar17);
            local_128.bitsConsumed = local_128.bitsConsumed + uVar17 * -8;
            local_128.bitContainer = *(size_t *)local_128.ptr;
          }
        }
        else {
          local_7c = uVar14;
          BIT_reloadDStreamFast(&local_128);
          uVar14 = local_7c;
        }
      }
      if (bVar2 != 0) {
        bVar11 = (byte)local_128.bitsConsumed;
        local_128.bitsConsumed = local_128.bitsConsumed + bVar2;
        uVar21 = uVar21 + ((local_128.bitContainer << (bVar11 & 0x3f)) >> (-bVar2 & 0x3f));
      }
      if (0x1f < bVar4) {
LAB_0070ba50:
        __assert_fail("nbBits < BIT_MASK_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                      ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
      }
      uVar17 = bVar4 + local_128.bitsConsumed;
      local_100.state =
           (~(-1L << (bVar4 & 0x3f)) & local_128.bitContainer >> (-(char)uVar17 & 0x3fU)) + local_38
      ;
      local_128.bitsConsumed = uVar17;
      if (0x1f < bVar5) goto LAB_0070ba50;
      local_128.bitsConsumed = uVar17 + bVar5;
      local_e0.state =
           (~(-1L << (bVar5 & 0x3f)) &
           local_128.bitContainer >> (-(char)local_128.bitsConsumed & 0x3fU)) + local_40;
      if (0x1f < (byte)uVar14) goto LAB_0070ba50;
      local_f0.state =
           (~(-1L << ((byte)uVar14 & 0x3f)) &
           local_128.bitContainer >> (-(char)(local_128.bitsConsumed + uVar14) & 0x3fU)) + local_48;
      local_128.bitsConsumed = local_128.bitsConsumed + uVar14;
      local_98 = uVar21;
      uStack_90 = uVar19;
      local_88 = sVar18;
      pBVar16 = local_a8 + uVar21;
      if (local_a0 < pBVar16) {
LAB_0070b665:
        sequence.matchLength = uVar19;
        sequence.litLength = uVar21;
        sequence.offset = sVar18;
        sVar20 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,oend,sequence,&local_a8,local_a0,local_60,local_68,local_70)
        ;
      }
      else {
        sVar20 = uVar19 + uVar21;
        pBVar1 = (BYTE *)((long)dst + sVar20);
        if (local_58 < pBVar1) goto LAB_0070b665;
        if ((long)uVar21 < 0) {
          __assert_fail("op <= oLitEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x3e3,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if ((long)sVar20 <= (long)uVar21) {
          __assert_fail("oLitEnd < oMatchEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x3e4,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (oend < pBVar1) {
          __assert_fail("oMatchEnd <= oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x3e5,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        __dest = (BYTE *)((long)dst + uVar21);
        if (local_58 < __dest) {
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,999,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar6 = *(undefined8 *)(local_a8 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_a8;
        *(undefined8 *)((long)dst + 8) = uVar6;
        if (0x10 < uVar21) {
          ZSTD_decompressSequences_cold_1();
        }
        pBVar13 = local_60;
        local_a8 = pBVar16;
        pBVar16 = __dest + -sVar18;
        if ((ulong)((long)__dest - (long)local_60) < local_88) {
          if ((ulong)((long)__dest - (long)local_68) < local_88) {
            sVar20 = 0xffffffffffffffec;
          }
          else {
            lVar8 = (long)(__dest + -sVar18) - (long)local_60;
            pBVar16 = local_70 + lVar8;
            if (local_70 < pBVar16 + uStack_90) {
              memmove(__dest,pBVar16,-lVar8);
              __dest = __dest + -lVar8;
              uStack_90 = uStack_90 + lVar8;
              pBVar16 = pBVar13;
              goto LAB_0070b53e;
            }
            memmove(__dest,pBVar16,uStack_90);
          }
        }
        else {
LAB_0070b53e:
          if (pBVar1 < __dest) {
            __assert_fail("op <= oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x408,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (pBVar16 < pBVar13) {
            __assert_fail("match >= prefixStart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x40a,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (uStack_90 == 0) {
            __assert_fail("sequence.matchLength >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x40b,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_88 < 0x10) {
            if (__dest < pBVar16) {
              __assert_fail("*ip <= *op",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x303,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (local_88 < 8) {
              iVar12 = *(int *)(ZSTD_overlapCopy8_dec64table + local_88 * 4);
              *__dest = *pBVar16;
              __dest[1] = pBVar16[1];
              __dest[2] = pBVar16[2];
              __dest[3] = pBVar16[3];
              pBVar13 = pBVar16 + *(uint *)(ZSTD_overlapCopy8_dec32table + local_88 * 4);
              pBVar16 = pBVar16 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + local_88 * 4) -
                                  (long)iVar12);
              *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar13;
            }
            else {
              *(undefined8 *)__dest = *(undefined8 *)pBVar16;
            }
            pBVar13 = pBVar16 + 8;
            pBVar15 = __dest + 8;
            lVar8 = (long)pBVar15 - (long)pBVar13;
            if (lVar8 < 8) {
              __assert_fail("*op - *ip >= 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x315,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (8 < uStack_90) {
              if (pBVar1 <= pBVar15) {
                __assert_fail("op < oMatchEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x41f,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (lVar8 < 0x10) {
                do {
                  *(undefined8 *)pBVar15 = *(undefined8 *)pBVar13;
                  pBVar15 = pBVar15 + 8;
                  pBVar13 = pBVar13 + 8;
                } while (pBVar15 < __dest + uStack_90);
              }
              else {
                if (0xffffffffffffffe0 < lVar8 - 0x10U) goto LAB_0070bba5;
                uVar6 = *(undefined8 *)(pBVar16 + 0x10);
                *(undefined8 *)pBVar15 = *(undefined8 *)pBVar13;
                *(undefined8 *)(__dest + 0x10) = uVar6;
                if (0x18 < (long)uStack_90) {
                  lVar8 = 0;
                  do {
                    uVar6 = *(undefined8 *)(pBVar16 + lVar8 + 0x18 + 8);
                    pBVar1 = __dest + lVar8 + 0x18;
                    *(undefined8 *)pBVar1 = *(undefined8 *)(pBVar16 + lVar8 + 0x18);
                    *(undefined8 *)(pBVar1 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(pBVar16 + lVar8 + 0x28 + 8);
                    *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar16 + lVar8 + 0x28);
                    *(undefined8 *)(pBVar1 + 0x18) = uVar6;
                    lVar8 = lVar8 + 0x20;
                  } while (pBVar1 + 0x20 < __dest + uStack_90);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar16)) {
LAB_0070bba5:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)(pBVar16 + 8);
            *(undefined8 *)__dest = *(undefined8 *)pBVar16;
            *(undefined8 *)(__dest + 8) = uVar6;
            if (0x10 < (long)uStack_90) {
              lVar8 = 0x10;
              do {
                uVar6 = *(undefined8 *)(pBVar16 + lVar8 + 8);
                pBVar1 = __dest + lVar8;
                *(undefined8 *)pBVar1 = *(undefined8 *)(pBVar16 + lVar8);
                *(undefined8 *)(pBVar1 + 8) = uVar6;
                uVar6 = *(undefined8 *)(pBVar16 + lVar8 + 0x10 + 8);
                *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar16 + lVar8 + 0x10);
                *(undefined8 *)(pBVar1 + 0x18) = uVar6;
                lVar8 = lVar8 + 0x20;
              } while (pBVar1 + 0x20 < __dest + uStack_90);
            }
          }
        }
      }
      if (sVar20 < 0xffffffffffffff89) {
        dst = (void *)((long)dst + sVar20);
        iVar12 = 0;
        nbSeq = nbSeq + -1;
        if (nbSeq == 0) {
          iVar12 = 5;
          bVar22 = false;
        }
        else {
          bVar22 = true;
          if (local_128.bitsConsumed < 0x41) {
            if (local_128.ptr < local_128.limitPtr) {
              if (local_128.ptr == local_128.start) goto LAB_0070b658;
              uVar17 = (int)local_128.ptr - (int)local_128.start;
              if (local_128.start <=
                  (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                uVar17 = local_128.bitsConsumed >> 3;
              }
              uVar14 = local_128.bitsConsumed + uVar17 * -8;
            }
            else {
              uVar17 = local_128.bitsConsumed >> 3;
              uVar14 = local_128.bitsConsumed & 7;
            }
            local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar17);
            local_128.bitsConsumed = uVar14;
            local_128.bitContainer = *(size_t *)local_128.ptr;
          }
        }
      }
      else {
        iVar12 = 1;
        bVar22 = false;
        local_78 = sVar20;
      }
LAB_0070b658:
    } while (iVar12 == 0);
    unaff_RBX = local_78;
    if (iVar12 == 5) {
      unaff_RBX = 0xffffffffffffffec;
      if (nbSeq == 0) {
        BVar7 = BIT_DStream_overflow;
        if (local_128.bitsConsumed < 0x41) {
          if (local_128.ptr < local_128.limitPtr) {
            if (local_128.ptr == local_128.start) {
              BVar7 = (local_128.bitsConsumed == 0x40) + BIT_DStream_endOfBuffer;
            }
            else {
              bVar22 = (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3)) <
                       local_128.start;
              uVar19 = (ulong)(uint)((int)local_128.ptr - (int)local_128.start);
              if (!bVar22) {
                uVar19 = (ulong)(local_128.bitsConsumed >> 3);
              }
              BVar7 = (BIT_DStream_status)bVar22;
              local_128.ptr = (char *)((long)local_128.ptr - uVar19);
              local_128.bitsConsumed = local_128.bitsConsumed + (int)uVar19 * -8;
              local_128.bitContainer = *(size_t *)local_128.ptr;
            }
          }
          else {
            BVar7 = BIT_reloadDStreamFast(&local_128);
          }
        }
        if (BVar7 < BIT_DStream_completed) {
          bVar22 = false;
        }
        else {
          lVar8 = 0;
          do {
            (local_50->entropy).rep[lVar8] = (U32)local_d0[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          bVar22 = true;
          unaff_RBX = local_78;
        }
      }
      else {
        bVar22 = false;
      }
    }
  }
  pBVar16 = local_b0;
  if (!bVar22) {
    return unaff_RBX;
  }
LAB_0070b9df:
  uVar21 = (long)local_a0 - (long)local_a8;
  uVar19 = (long)oend - (long)dst;
  if (uVar19 < uVar21) {
    unaff_RBX = 0xffffffffffffffba;
  }
  else if ((BYTE *)dst == (BYTE *)0x0) {
    dst = (BYTE *)0x0;
  }
  else {
    memcpy(dst,local_a8,uVar21);
    dst = (void *)((long)dst + uVar21);
  }
  if (uVar21 <= uVar19) {
    unaff_RBX = (long)dst - (long)pBVar16;
  }
  return unaff_RBX;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset,
                   const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
    return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}